

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O3

char * ossprvcmd(char *hst)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (histtail == hst) {
    return (char *)0x0;
  }
  pcVar1 = histbuf + 1000;
  if (histbuf == hst) {
    hst = pcVar1;
  }
  pcVar2 = hst + -1;
  do {
    pcVar3 = pcVar2;
    if (histbuf == pcVar2) {
      pcVar3 = pcVar1;
    }
    pcVar2 = pcVar3 + -1;
  } while ((pcVar3[-1] != '\0') && (pcVar2 != histtail));
  if (pcVar3[-1] != '\0') {
    return pcVar2;
  }
  pcVar2 = histbuf;
  if (pcVar3 < pcVar1) {
    pcVar2 = pcVar3;
  }
  return pcVar2;
}

Assistant:

char *ossprvcmd(char *hst)
{
    /* check to see if we're already at the fist command */
    if (hst == histtail)
        return 0;

    /* back up to the previous null byte */
    hst = ossdechp(hst);

    /* scan back to the previous line */
    do
    {
        hst = ossdechp(hst);
    } while (*hst && hst != histtail);

    /* step over the null byte to the start of the following line */
    if (*hst == 0)
        hst = ossadvhp(hst);

    /* return the result */
    return hst;
}